

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  ImGuiViewportP *pIVar1;
  ImGuiWindow *window_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiWindow **ppIVar5;
  ImGuiWindow *child;
  int i;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  int layer_local;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  ppIVar4 = ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
  pIVar1 = *ppIVar4;
  (pIVar2->IO).MetricsRenderWindows = (pIVar2->IO).MetricsRenderWindows + 1;
  AddDrawListToDrawData((pIVar1->DrawDataBuilder).Layers + layer,window->DrawList);
  for (child._4_4_ = 0; child._4_4_ < (window->DC).ChildWindows.Size; child._4_4_ = child._4_4_ + 1)
  {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&(window->DC).ChildWindows,child._4_4_);
    window_00 = *ppIVar5;
    bVar3 = IsWindowActiveAndVisible(window_00);
    if (bVar3) {
      AddWindowToDrawData(window_00,layer);
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}